

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxwritestate.hpp
# Opt level: O3

bool __thiscall
soplex::SPxSolverBase<double>::writeState
          (SPxSolverBase<double> *this,char *filename,NameSet *rowNames,NameSet *colNames,
          bool cpxFormat,bool writeZeroObjective)

{
  Real RVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  double *pdVar6;
  long *plVar7;
  undefined1 uVar8;
  char *pcVar9;
  char *pcVar10;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  long lVar11;
  string ofname;
  ofstream ofs;
  allocator local_2a9;
  long *local_2a8 [2];
  long local_298 [2];
  uint local_288;
  undefined4 local_284;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  undefined1 *local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  NameSet *local_240;
  NameSet *local_238;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_260 = &local_250;
  local_258 = 0;
  local_250 = 0;
  local_240 = rowNames;
  local_238 = colNames;
  std::ofstream::ofstream(&local_230);
  std::__cxx11::string::string((string *)local_2a8,filename,&local_2a9);
  local_284 = (undefined4)CONCAT71(in_register_00000089,writeZeroObjective);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_2a8);
  plVar7 = plVar4 + 2;
  local_288 = (uint)CONCAT71(in_register_00000081,cpxFormat);
  if ((long *)*plVar4 == plVar7) {
    local_270 = *plVar7;
    lStack_268 = plVar4[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar7;
    local_280 = (long *)*plVar4;
  }
  local_278 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_260,(string *)&local_280);
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_260);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# SoPlex version ",0x11);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&local_230,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".",1);
    plVar4 = (long *)std::ostream::operator<<((ostream *)poVar5,0);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# run SoPlex as follows:",0x18);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,
               "# bin/soplex --loadset=spxcheck.set --readbas=spxcheck.bas spxcheck.mps\n",0x48);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"int:representation = ",0x15);
    pcVar9 = "1";
    pcVar10 = 
    "7.275957614183425903320312500000000000000000000000000000000000000000000000000000000000000000000000000e-12"
    ;
    if (this->theRep == COLUMN) {
      pcVar10 = 
      "5.820766091346740722656250000000000000000000000000000000000000000000000000000000000000000000000000000e-11"
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar10 + 0x68,1);
    std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
    std::ostream::put((char)&local_230);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"int:factor_update_max = ",0x18);
    plVar4 = (long *)std::ostream::operator<<
                               ((ostream *)&local_230,(this->super_SPxBasisBase<double>).maxUpdates)
    ;
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"int:pricer = ",0xd);
    iVar3 = (**this->thepricer->_vptr_SPxPricer)();
    iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"Auto");
    if (iVar3 == 0) {
      lVar11 = 2;
      pcVar9 = " 0";
LAB_001da477:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar9,lVar11);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    else {
      iVar3 = (**this->thepricer->_vptr_SPxPricer)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"Dantzig");
      lVar11 = 1;
      if (iVar3 == 0) goto LAB_001da477;
      iVar3 = (**this->thepricer->_vptr_SPxPricer)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_01,iVar3),"ParMult");
      if (iVar3 == 0) {
        pcVar9 = "2";
        goto LAB_001da477;
      }
      iVar3 = (**this->thepricer->_vptr_SPxPricer)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_02,iVar3),"Devex");
      if (iVar3 == 0) {
        pcVar9 = "3";
        goto LAB_001da477;
      }
      iVar3 = (**this->thepricer->_vptr_SPxPricer)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_03,iVar3),"Steep");
      if (iVar3 == 0) {
        pcVar9 = "4";
        goto LAB_001da477;
      }
      iVar3 = (**this->thepricer->_vptr_SPxPricer)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_04,iVar3),"SteepEx");
      if (iVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"5",1);
        std::endl<char,std::char_traits<char>>((ostream *)&local_230);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"int:ratiotester = ",0x12);
    iVar3 = (**this->theratiotester->_vptr_SPxRatioTester)();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_05,iVar3),"Default");
    if (iVar3 == 0) {
      pcVar10 = "0";
LAB_001da575:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar10,1);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    else {
      iVar3 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_06,iVar3),"Harris");
      if (iVar3 == 0) {
        pcVar10 = "1";
        goto LAB_001da575;
      }
      iVar3 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_07,iVar3),"Fast");
      if (iVar3 == 0) {
        pcVar10 = "2";
        goto LAB_001da575;
      }
      iVar3 = (**this->theratiotester->_vptr_SPxRatioTester)();
      iVar3 = strcmp((char *)CONCAT44(extraout_var_08,iVar3),"Bound Flipping");
      if (iVar3 == 0) {
        pcVar10 = "3";
        goto LAB_001da575;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"real:feastol = ",0xf);
    RVar1 = Tolerances::floatingPointFeastol
                      ((this->super_SPxLPBase<double>)._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar5 = std::ostream::_M_insert<double>(RVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"real:opttol = ",0xe);
    RVar1 = Tolerances::floatingPointOpttol
                      ((this->super_SPxLPBase<double>)._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    poVar5 = std::ostream::_M_insert<double>(RVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"real:epsilon_zero = ",0x14);
    RVar1 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    poVar5 = std::ostream::_M_insert<double>(RVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"real:infty = ",0xd);
    ::soplex::infinity::__tls_init();
    pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
    poVar5 = std::ostream::_M_insert<double>(*pdVar6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"uint:random_seed = ",0x13);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::ofstream::close();
    std::__cxx11::string::string((string *)local_2a8,filename,&local_2a9);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_2a8);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_270 = *plVar7;
      lStack_268 = plVar4[3];
      local_280 = &local_270;
    }
    else {
      local_270 = *plVar7;
      local_280 = (long *)*plVar4;
    }
    local_278 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_260,(string *)&local_280);
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0],local_298[0] + 1);
    }
    std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_260);
    if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x21])
                (this,&local_230,local_240,local_238,0,(ulong)(byte)local_284);
      std::ofstream::close();
      std::__cxx11::string::string((string *)local_2a8,filename,&local_2a9);
      plVar4 = (long *)std::__cxx11::string::append((char *)local_2a8);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_270 = *plVar7;
        lStack_268 = plVar4[3];
        local_280 = &local_270;
      }
      else {
        local_270 = *plVar7;
        local_280 = (long *)*plVar4;
      }
      local_278 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_260,(string *)&local_280);
      if (local_280 != &local_270) {
        operator_delete(local_280,local_270 + 1);
      }
      uVar2 = local_288;
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0],local_298[0] + 1);
      }
      iVar3 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5b])
                        (this,local_260,local_240,local_238,(ulong)(uVar2 & 0xff));
      uVar8 = (undefined1)iVar3;
      goto LAB_001da87c;
    }
  }
  uVar8 = 0;
LAB_001da87c:
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  if (local_260 != &local_250) {
    operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
  }
  return (bool)uVar8;
}

Assistant:

bool SPxSolverBase<R>::writeState(
   const char*    filename,
   const NameSet* rowNames,
   const NameSet* colNames,
   const bool     cpxFormat,
   const bool     writeZeroObjective
) const
{

   std::string ofname;
   std::ofstream ofs;

   // write parameter settings
   ofname = std::string(filename) + ".set";
   ofs.open(ofname.c_str());

   if(!ofs)
      return false;

   ofs << "# SoPlex version " << SOPLEX_VERSION / 100
       << "." << (SOPLEX_VERSION / 10) % 10
       << "." << SOPLEX_VERSION % 10 << std::endl << std::endl;
   ofs << "# run SoPlex as follows:" << std::endl;
   ofs << "# bin/soplex --loadset=spxcheck.set --readbas=spxcheck.bas spxcheck.mps\n" << std::endl;
   ofs << "int:representation = " << (rep() == SPxSolverBase<R>::COLUMN ? "1" : "2") << std::endl;
   ofs << "int:factor_update_max = " << basis().getMaxUpdates() << std::endl;
   ofs << "int:pricer = ";

   if(!strcmp(pricer()->getName(), "Auto"))
      ofs << " 0" << std::endl;
   else if(!strcmp(pricer()->getName(), "Dantzig"))
      ofs << "1" << std::endl;
   else if(!strcmp(pricer()->getName(), "ParMult"))
      ofs << "2" << std::endl;
   else if(!strcmp(pricer()->getName(), "Devex"))
      ofs << "3" << std::endl;
   else if(!strcmp(pricer()->getName(), "Steep"))
      ofs << "4" << std::endl;
   else if(!strcmp(pricer()->getName(), "SteepEx"))
      ofs << "5" << std::endl;

   ofs << "int:ratiotester = ";

   if(!strcmp(ratiotester()->getName(), "Default"))
      ofs << "0" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Harris"))
      ofs << "1" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Fast"))
      ofs << "2" << std::endl;
   else if(!strcmp(ratiotester()->getName(), "Bound Flipping"))
      ofs << "3" << std::endl;

   ofs << "real:feastol = " << tolerances()->floatingPointFeastol() << std::endl;
   ofs << "real:opttol = " << tolerances()->floatingPointOpttol() << std::endl;
   ofs << "real:epsilon_zero = " << epsilon() << std::endl;
   ofs << "real:infty = " << infinity << std::endl;
   ofs << "uint:random_seed = " << random.getSeed() << std::endl;
   ofs.close();

   // write LP
   ofname = std::string(filename) + ".mps";
   ofs.open(ofname.c_str());

   if(!ofs)
      return false;

   this->writeMPS(ofs, rowNames, colNames, nullptr, writeZeroObjective);
   ofs.close();

   // write basis
   ofname = std::string(filename) + ".bas";
   return writeBasisFile(ofname.c_str(), rowNames, colNames, cpxFormat);
}